

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void __thiscall
obx::BoxTypeless::BoxTypeless(BoxTypeless *this,Store *store,obx_schema_id entityTypeId)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  obx_err err;
  OBX_store *pOVar4;
  OBX_box *pOVar5;
  long *plVar6;
  long *plVar7;
  obx_schema_id oVar8;
  long *contextPrefix;
  string msg;
  string __str;
  long local_58;
  long lStack_50;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  this->store_ = store;
  pOVar4 = Store::cPtr(store);
  pOVar5 = (OBX_box *)obx_box(pOVar4,entityTypeId);
  this->cBox_ = pOVar5;
  this->entityTypeId_ = entityTypeId;
  if (pOVar5 == (OBX_box *)0x0) {
    cVar3 = '\x01';
    if (9 < entityTypeId) {
      oVar8 = entityTypeId;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (oVar8 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00109486;
        }
        if (oVar8 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00109486;
        }
        if (oVar8 < 10000) goto LAB_00109486;
        bVar1 = 99999 < oVar8;
        oVar8 = oVar8 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_00109486:
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_48,local_40,entityTypeId);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x10d78e);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_58 = *plVar7;
      lStack_50 = plVar6[3];
      contextPrefix = &local_58;
    }
    else {
      local_58 = *plVar7;
      contextPrefix = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if (this->cBox_ == (OBX_box *)0x0) {
      err = obx_last_error_code();
      internal::throwLastError(err,(char *)contextPrefix);
    }
    if (contextPrefix != &local_58) {
      operator_delete(contextPrefix);
    }
  }
  return;
}

Assistant:

BoxTypeless(Store& store, obx_schema_id entityTypeId)
        : store_(store), cBox_(obx_box(store.cPtr(), entityTypeId)), entityTypeId_(entityTypeId) {
        if (cBox_ == nullptr) {
            std::string msg = "Can not create box for entity type ID " + std::to_string(entityTypeId_);
            internal::checkPtrOrThrow(cBox_, msg.c_str());
        }
    }